

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

OutlierClassification *
Catch::Benchmark::Detail::classify_outliers
          (OutlierClassification *__return_storage_ptr__,const_iterator first,const_iterator last)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  const_iterator cVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  allocator_type local_41;
  double local_40;
  vector<double,_std::allocator<double>_> copy;
  
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&copy,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             first._M_current,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             last._M_current,&local_41);
  local_40 = weighted_average_quantile
                       (1,4,(iterator)
                            copy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                        (iterator)
                        copy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish);
  dVar7 = weighted_average_quantile
                    (3,4,(iterator)
                         copy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                     (iterator)
                     copy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  dVar9 = (dVar7 - local_40) * 3.0;
  dVar8 = (dVar7 - local_40) * 1.5;
  iVar2 = 0;
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  for (cVar6._M_current = first._M_current; cVar6._M_current != last._M_current;
      cVar6._M_current = cVar6._M_current + 1) {
    dVar1 = *cVar6._M_current;
    if (local_40 - dVar9 <= dVar1) {
      if (local_40 - dVar8 <= dVar1) {
        if (dVar1 <= dVar9 + dVar7) {
          if (dVar8 + dVar7 < dVar1) {
            iVar5 = iVar5 + 1;
          }
        }
        else {
          iVar4 = iVar4 + 1;
        }
      }
      else {
        iVar3 = iVar3 + 1;
      }
    }
    else {
      iVar2 = iVar2 + 1;
    }
  }
  __return_storage_ptr__->high_mild = iVar5;
  __return_storage_ptr__->high_severe = iVar4;
  __return_storage_ptr__->low_mild = iVar3;
  __return_storage_ptr__->low_severe = iVar2;
  __return_storage_ptr__->samples_seen =
       (int)((ulong)((long)last._M_current - (long)first._M_current) >> 3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&copy.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

OutlierClassification
            classify_outliers( std::vector<double>::const_iterator first,
                               std::vector<double>::const_iterator last ) {
                std::vector<double> copy( first, last );

                auto q1 = weighted_average_quantile( 1, 4, copy.begin(), copy.end() );
                auto q3 = weighted_average_quantile( 3, 4, copy.begin(), copy.end() );
                auto iqr = q3 - q1;
                auto los = q1 - ( iqr * 3. );
                auto lom = q1 - ( iqr * 1.5 );
                auto him = q3 + ( iqr * 1.5 );
                auto his = q3 + ( iqr * 3. );

                OutlierClassification o;
                for ( ; first != last; ++first ) {
                    const double t = *first;
                    if ( t < los ) {
                        ++o.low_severe;
                    } else if ( t < lom ) {
                        ++o.low_mild;
                    } else if ( t > his ) {
                        ++o.high_severe;
                    } else if ( t > him ) {
                        ++o.high_mild;
                    }
                    ++o.samples_seen;
                }
                return o;
            }